

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void __thiscall MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(MemoryLeakWarningPlugin *this)

{
  (this->super_TestPlugin)._vptr_TestPlugin = (_func_int **)&PTR__MemoryLeakWarningPlugin_00165fc8;
  if (this->destroyGlobalDetectorAndTurnOfMemoryLeakDetectionInDestructor_ == true) {
    turnOffNewDeleteOverloads();
    destroyGlobalDetector();
  }
  TestPlugin::~TestPlugin(&this->super_TestPlugin);
  return;
}

Assistant:

MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin()
{
    if (destroyGlobalDetectorAndTurnOfMemoryLeakDetectionInDestructor_) {
        MemoryLeakWarningPlugin::turnOffNewDeleteOverloads();
        MemoryLeakWarningPlugin::destroyGlobalDetector();
    }
}